

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugutils.cpp
# Opt level: O0

void DebugUtils::dumpToConsole(LEFCellInfo_t *cell)

{
  ostream *poVar1;
  char *pcVar2;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  LEFCellInfo_t *local_10;
  LEFCellInfo_t *cell_local;
  
  local_10 = cell;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"\n");
  if (local_10 == (LEFCellInfo_t *)0x0) {
    std::operator<<(local_188,"Error: cell is a nullptr!\n");
  }
  else {
    poVar1 = std::operator<<(local_188,"Name:    ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(local_188,"Foreign  ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(local_188,"Width    ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10->m_sx);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(local_188,"Height   ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10->m_sy);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(local_188,"Type     ");
    pcVar2 = "REGULAR";
    if ((local_10->m_isFiller & 1U) != 0) {
      pcVar2 = "FILLER";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(local_188,"Symmetry ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,"\n");
  }
  std::__cxx11::stringstream::str();
  doLog(3,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void DebugUtils::dumpToConsole(const PRLEFReader::LEFCellInfo_t *cell)
{
    std::stringstream ss;
    ss << "\n";

    if (cell != nullptr)
    {
        ss << "Name:    " << cell->m_name.c_str() << "\n";
        ss << "Foreign  " << cell->m_foreign.c_str() << "\n";
        ss << "Width    " << cell->m_sx << "\n";
        ss << "Height   " << cell->m_sy << "\n";
        ss << "Type     " << (cell->m_isFiller ? "FILLER" : "REGULAR") << "\n";
        ss << "Symmetry " << cell->m_symmetry.c_str() << "\n";
    }
    else
    {
        ss << "Error: cell is a nullptr!\n";
    }
    doLog(LOG_INFO, ss.str());
}